

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_process.c
# Opt level: O1

ares_status_t
ares_process_fds_nolock(ares_channel_t *channel,ares_fd_events_t *events,size_t nevents,uint flags)

{
  ares_htable_szvp_t *htable;
  ares_dns_record_t *paVar1;
  ares_dns_record_t *paVar2;
  long lVar3;
  bool bVar4;
  unsigned_short uVar5;
  ares_conn_err_t requeue_status;
  ares_status_t aVar6;
  ares_bool_t aVar7;
  ares_dns_rcode_t aVar8;
  ares_dns_rec_type_t aVar9;
  ares_conn_err_t aVar10;
  ares_status_t aVar11;
  int iVar12;
  ares_conn_t *paVar13;
  size_t sVar14;
  uchar *puVar15;
  size_t sVar16;
  ares_dns_rr_t *paVar17;
  ares_dns_rr_t *paVar18;
  ares_query_t *paVar19;
  ares_fd_events_t *paVar20;
  ares_slist_node_t *node;
  char cVar21;
  ares_server_t *paVar22;
  ares_query_t *query;
  ares_buf_t *buf;
  ares_conn_err_t aVar23;
  size_t sVar24;
  ares_channel_t *channel_00;
  unsigned_short dns_len;
  char *aname;
  ares_array_t *requeue;
  size_t count;
  ares_timeval_t now;
  size_t data_len;
  ares_dns_class_t qclass;
  ares_dns_rec_type_t atype;
  ares_dns_rec_type_t qtype;
  ares_dns_record_t *local_d0;
  unsigned_short local_c2;
  ares_query_t *local_c0;
  char *local_b8;
  ares_array_t *local_b0;
  ares_dns_record_t *local_a8;
  ares_channel_t *local_a0;
  ares_fd_events_t *local_98;
  char *local_90;
  ares_server_t *local_88;
  size_t local_80;
  ares_timeval_t local_78;
  size_t local_68;
  uint local_5c;
  ares_dns_class_t local_58;
  ares_dns_class_t local_54;
  ares_dns_rec_type_t local_50;
  ares_dns_rec_type_t local_4c;
  ares_server_t *local_48;
  ares_channel_t *local_40;
  ares_channel_t *local_38;
  
  if (events == (ares_fd_events_t *)0x0 && nevents != 0) {
    return ARES_EFORMERR;
  }
  local_98 = events;
  ares_tvnow(&local_78);
  paVar20 = local_98;
  local_80 = nevents;
  if (nevents == 0) {
    requeue_status = ARES_CONN_ERR_SUCCESS;
  }
  else {
    requeue_status = ARES_CONN_ERR_SUCCESS;
    sVar24 = 0;
    do {
      if ((paVar20[sVar24].fd != -1) && ((paVar20[sVar24].events & 2) != 0)) {
        paVar13 = ares_conn_from_fd(channel,paVar20[sVar24].fd);
        if (paVar13 == (ares_conn_t *)0x0) {
          requeue_status = ARES_CONN_ERR_SUCCESS;
        }
        else {
          if ((paVar13->flags & ARES_CONN_FLAG_TFO_INITIAL) == ARES_CONN_FLAG_NONE) {
            *(undefined1 *)&paVar13->state_flags =
                 (char)paVar13->state_flags | ARES_CONN_STATE_CONNECTED;
          }
          requeue_status = ares_conn_flush(paVar13);
          if (requeue_status != ARES_CONN_ERR_SUCCESS) {
            server_increment_failures(paVar13->server,paVar13->flags & ARES_TRUE);
            ares_close_connection(paVar13,requeue_status);
          }
        }
        paVar20 = local_98;
        nevents = local_80;
        if (requeue_status == ARES_CONN_ERR_INVALID) goto LAB_00113f9f;
      }
      sVar24 = sVar24 + 1;
    } while (nevents != sVar24);
  }
  local_5c = flags;
  if (nevents != 0) {
    sVar24 = 0;
    local_38 = channel;
    do {
      if ((paVar20[sVar24].fd != -1) && ((paVar20[sVar24].events & 1) != 0)) {
        paVar13 = ares_conn_from_fd(channel,paVar20[sVar24].fd);
        if (paVar13 == (ares_conn_t *)0x0) {
          requeue_status = ARES_CONN_ERR_SUCCESS;
        }
        else {
          local_a0 = paVar13->server->channel;
          do {
            local_b8 = (char *)0xffff;
            sVar14 = ares_buf_len(paVar13->in_buf);
            if ((((paVar13->flags & ARES_CONN_FLAG_TCP) == ARES_CONN_FLAG_NONE) &&
                (aVar6 = ares_buf_append_be16(paVar13->in_buf,0), aVar6 != ARES_SUCCESS)) ||
               (puVar15 = ares_buf_append_start(paVar13->in_buf,(size_t *)&local_b8),
               puVar15 == (uchar *)0x0)) {
              bVar4 = false;
              ares_close_connection(paVar13,ARES_SUCCESS);
              iVar12 = 1;
            }
            else {
              requeue_status = ares_conn_read(paVar13,puVar15,(size_t)local_b8,(size_t *)&local_90);
              if (requeue_status == ARES_CONN_ERR_SUCCESS) {
                ares_buf_append_finish(paVar13->in_buf,(size_t)local_90);
                bVar4 = true;
                if ((((local_a0->sock_funcs).flags & 1) != 0) &&
                   (((paVar13->flags & ARES_CONN_FLAG_TCP) == ARES_CONN_FLAG_NONE ||
                    (local_90 == local_b8)))) {
                  bVar4 = false;
                }
                requeue_status = ARES_CONN_ERR_SUCCESS;
                if ((paVar13->flags & ARES_CONN_FLAG_TCP) == ARES_CONN_FLAG_NONE) {
                  local_b8 = (char *)ares_buf_len(paVar13->in_buf);
                  ares_buf_set_length(paVar13->in_buf,sVar14);
                  ares_buf_append_be16(paVar13->in_buf,(unsigned_short)local_90);
                  ares_buf_set_length(paVar13->in_buf,(size_t)local_b8);
                }
                iVar12 = 0;
              }
              else {
                bVar4 = false;
                ares_buf_append_finish(paVar13->in_buf,0);
                iVar12 = 2;
                if ((paVar13->flags & ARES_CONN_FLAG_TCP) == ARES_CONN_FLAG_NONE) {
                  ares_buf_set_length(paVar13->in_buf,sVar14);
                  bVar4 = false;
                }
              }
            }
            if (iVar12 != 0) {
              if (iVar12 != 2) {
                requeue_status = ARES_CONN_ERR_INVALID;
                goto LAB_0011391e;
              }
              break;
            }
          } while (!bVar4);
          if (requeue_status < ARES_CONN_ERR_CONNCLOSED) {
            requeue_status = ARES_CONN_ERR_SUCCESS;
            bVar4 = true;
          }
          else {
            server_increment_failures(paVar13->server,paVar13->flags & ARES_TRUE);
            requeue_status = ARES_CONN_ERR_INTERRUPT;
            ares_close_connection(paVar13,ARES_ECONNREFUSED);
LAB_0011391e:
            bVar4 = false;
          }
          if (bVar4) {
            channel_00 = paVar13->server->channel;
            local_b0 = (ares_array_t *)0x0;
            do {
              local_c2 = 0;
              local_68 = 0;
              ares_buf_tag(paVar13->in_buf);
              requeue_status = ares_buf_fetch_be16(paVar13->in_buf,&local_c2);
              buf = paVar13->in_buf;
              if (requeue_status == ARES_CONN_ERR_SUCCESS) {
                requeue_status = ares_buf_consume(buf,(ulong)local_c2);
                buf = paVar13->in_buf;
                if (requeue_status != ARES_CONN_ERR_SUCCESS) goto LAB_00113984;
                puVar15 = ares_buf_tag_fetch(buf,&local_68);
                if (local_68 < 2 || puVar15 == (uchar *)0x0) {
                  ares_buf_tag_clear(paVar13->in_buf);
                  iVar12 = 3;
                  requeue_status = ARES_CONN_ERR_SUCCESS;
                }
                else {
                  local_68 = local_68 - 2;
                  paVar22 = paVar13->server;
                  local_d0 = (ares_dns_record_t *)0x0;
                  if (local_68 == 0) {
                    requeue_status = ARES_CONN_ERR_SUCCESS;
                  }
                  else {
                    aVar6 = ares_dns_parse(puVar15 + 2,local_68,0,&local_d0);
                    cVar21 = '\x01';
                    requeue_status = ARES_CONN_ERR_NETUNREACH;
                    if (aVar6 == ARES_SUCCESS) {
                      htable = channel_00->queries_by_qid;
                      uVar5 = ares_dns_record_get_id(local_d0);
                      paVar19 = (ares_query_t *)ares_htable_szvp_get_direct(htable,(ulong)uVar5);
                      paVar2 = local_d0;
                      requeue_status = ARES_CONN_ERR_SUCCESS;
                      aVar23 = ARES_CONN_ERR_SUCCESS;
                      aVar10 = requeue_status;
                      if (paVar19 == (ares_query_t *)0x0) {
LAB_00113e16:
                        requeue_status = aVar10;
                        cVar21 = '\x01';
                      }
                      else {
                        local_40 = paVar19->channel;
                        paVar1 = paVar19->query;
                        local_c0 = paVar19;
                        local_a0 = channel_00;
                        local_48 = paVar22;
                        sVar14 = ares_dns_record_query_cnt(paVar1);
                        local_a8 = paVar2;
                        sVar16 = ares_dns_record_query_cnt(paVar2);
                        if (sVar14 == sVar16) {
                          sVar14 = ares_dns_record_query_cnt(paVar1);
                          if (sVar14 != 0) {
                            sVar14 = 0;
                            do {
                              local_90 = (char *)0x0;
                              local_b8 = (char *)0x0;
                              aVar6 = ares_dns_record_query_get
                                                (paVar1,sVar14,&local_90,&local_4c,&local_54);
                              channel_00 = local_a0;
                              aVar10 = requeue_status;
                              if (((aVar6 != ARES_SUCCESS) || (local_90 == (char *)0x0)) ||
                                 ((aVar6 = ares_dns_record_query_get
                                                     (local_a8,sVar14,&local_b8,&local_50,&local_58)
                                  , aVar10 = aVar23, aVar6 != ARES_SUCCESS ||
                                  (((local_b8 == (char *)0x0 || (local_4c != local_50)) ||
                                   (local_54 != local_58)))))) goto LAB_00113e16;
                              if (((local_40->flags & 0x400) == 0) ||
                                 (local_c0->using_tcp != ARES_FALSE)) {
                                aVar7 = ares_strcaseeq(local_90,local_b8);
                              }
                              else {
                                aVar7 = ares_streq(local_90,local_b8);
                              }
                              if (aVar7 == ARES_FALSE) goto LAB_00113e16;
                              sVar14 = sVar14 + 1;
                              sVar16 = ares_dns_record_query_cnt(paVar1);
                            } while (sVar14 < sVar16);
                          }
                          paVar19 = local_c0;
                          aVar6 = ares_cookie_validate
                                            (local_c0,local_d0,paVar13,&local_78,&local_b0);
                          if (aVar6 == ARES_SUCCESS) {
                            ares_llist_node_destroy(paVar19->node_queries_to_conn);
                            paVar1 = local_d0;
                            paVar19->node_queries_to_conn = (ares_llist_node_t *)0x0;
                            paVar2 = paVar19->query;
                            aVar8 = ares_dns_record_get_rcode(local_d0);
                            channel_00 = local_a0;
                            if (((aVar8 == ARES_RCODE_FORMERR) &&
                                (paVar17 = ares_dns_get_opt_rr_const(paVar2),
                                paVar17 != (ares_dns_rr_t *)0x0)) &&
                               ((paVar18 = ares_dns_get_opt_rr_const(paVar1),
                                paVar18 == (ares_dns_rr_t *)0x0 ||
                                ((sVar14 = ares_dns_rr_get_opt_cnt(paVar17,ARES_RR_OPT_OPTIONS),
                                 sVar14 != 0 &&
                                 (paVar17 = ares_dns_get_opt_rr_const(paVar1),
                                 paVar17 != (ares_dns_rr_t *)0x0)))))) {
                              paVar19 = local_c0;
                              sVar14 = ares_dns_record_rr_cnt
                                                 (local_c0->query,ARES_SECTION_ADDITIONAL);
                              if (sVar14 == 0) {
                                aVar10 = ARES_CONN_ERR_CONNCLOSED;
                              }
                              else {
                                local_a8 = (ares_dns_record_t *)0x0;
                                sVar14 = 0;
                                do {
                                  paVar17 = ares_dns_record_rr_get
                                                      (paVar19->query,ARES_SECTION_ADDITIONAL,sVar14
                                                      );
                                  aVar9 = ares_dns_rr_get_type(paVar17);
                                  paVar19 = local_c0;
                                  if (aVar9 == ARES_REC_TYPE_OPT) {
                                    ares_dns_record_rr_del
                                              (local_c0->query,ARES_SECTION_ADDITIONAL,sVar14);
                                    local_a8 = (ares_dns_record_t *)0x1;
                                    paVar19 = local_c0;
                                    break;
                                  }
                                  sVar14 = sVar14 + 1;
                                  sVar16 = ares_dns_record_rr_cnt
                                                     (local_c0->query,ARES_SECTION_ADDITIONAL);
                                } while (sVar14 < sVar16);
                                aVar10 = (uint)((int)local_a8 == 0) * 2;
                              }
                              paVar22 = local_48;
                              if (aVar10 != ARES_CONN_ERR_SUCCESS) {
                                end_query(channel_00,local_48,paVar19,aVar10,
                                          (ares_dns_record_t *)0x0);
                                goto LAB_00113e16;
                              }
                            }
                            else {
                              uVar5 = ares_dns_record_get_flags(local_d0);
                              paVar22 = local_48;
                              paVar19 = local_c0;
                              if (((uVar5 & 4) == 0) ||
                                 (((paVar13->flags & ARES_CONN_FLAG_TCP) != ARES_CONN_FLAG_NONE ||
                                  ((channel_00->flags & 4) != 0)))) {
                                query = local_c0;
                                if ((channel_00->flags & 0x80) == 0) {
                                  aVar8 = ares_dns_record_get_rcode(local_d0);
                                  query = local_c0;
                                  if (aVar8 == ARES_RCODE_SERVFAIL) {
                                    aVar6 = ARES_ESERVFAIL;
LAB_00113d47:
                                    server_increment_failures(paVar22,local_c0->using_tcp);
                                    requeue_status =
                                         ares_requeue_query(query,&local_78,aVar6,ARES_TRUE,local_d0
                                                            ,&local_b0);
                                    aVar10 = ARES_CONN_ERR_SUCCESS;
                                    if (requeue_status != ARES_CONN_ERR_INVALID) {
                                      requeue_status = aVar10;
                                    }
                                  }
                                  else {
                                    if (aVar8 == ARES_RCODE_REFUSED) {
                                      aVar6 = ARES_EREFUSED;
                                      goto LAB_00113d47;
                                    }
                                    if (aVar8 == ARES_RCODE_NOTIMP) {
                                      aVar6 = ARES_ENOTIMP;
                                      goto LAB_00113d47;
                                    }
                                    aVar10 = ARES_CONN_ERR_WOULDBLOCK;
                                    query = paVar19;
                                    requeue_status = ARES_CONN_ERR_SUCCESS;
                                  }
                                  cVar21 = '\x01';
                                  if ((char)aVar10 == '\0') goto LAB_00113e18;
                                }
                                aVar6 = ares_qcache_insert(channel_00,&local_78,query,local_d0);
                                local_a8 = (ares_dns_record_t *)
                                           CONCAT71(local_a8._1_7_,aVar6 != ARES_SUCCESS);
                                server_set_good(paVar22,query->using_tcp);
                                requeue_status = ARES_CONN_ERR_SUCCESS;
                                end_query(channel_00,paVar22,query,ARES_SUCCESS,local_d0);
                                cVar21 = (char)local_a8;
                                goto LAB_00113e18;
                              }
                              local_c0->using_tcp = ARES_TRUE;
                              paVar22 = (ares_server_t *)0x0;
                            }
                            aVar10 = ares_append_requeue(&local_b0,paVar19,paVar22);
                            goto LAB_00113e16;
                          }
                        }
                        cVar21 = '\x01';
                        channel_00 = local_a0;
                      }
                    }
LAB_00113e18:
                    if (cVar21 != '\0') {
                      ares_dns_record_destroy(local_d0);
                    }
                  }
                  if (requeue_status == ARES_CONN_ERR_SUCCESS) {
                    ares_buf_tag_clear(paVar13->in_buf);
                    requeue_status = ARES_CONN_ERR_SUCCESS;
                    iVar12 = 0;
                  }
                  else {
                    server_increment_failures(paVar13->server,paVar13->flags & ARES_TRUE);
                    ares_close_connection(paVar13,requeue_status);
                    iVar12 = 4;
                  }
                }
              }
              else {
LAB_00113984:
                ares_buf_tag_rollback(buf);
                iVar12 = 3;
              }
            } while (iVar12 == 0);
            if (iVar12 - 3U < 2) {
              do {
                sVar14 = ares_array_len(local_b0);
                if (sVar14 == 0) break;
                aVar6 = ares_array_claim_at(&local_90,0x10,local_b0,0);
                if (((aVar6 == ARES_SUCCESS) &&
                    (paVar19 = (ares_query_t *)
                               ares_htable_szvp_get_direct
                                         (channel_00->queries_by_qid,(ulong)local_90 & 0xffff),
                    paVar19 != (ares_query_t *)0x0)) &&
                   (aVar11 = ares_send_query(local_88,paVar19,&local_78), aVar11 == ARES_ENOMEM)) {
                  requeue_status = ARES_CONN_ERR_INVALID;
                }
              } while (aVar6 == ARES_SUCCESS);
              ares_array_destroy(local_b0);
            }
          }
        }
        paVar20 = local_98;
        nevents = local_80;
        channel = local_38;
        if (requeue_status == ARES_CONN_ERR_INVALID) goto LAB_00113f9f;
      }
      sVar24 = sVar24 + 1;
    } while (sVar24 != nevents);
  }
  if ((local_5c & 1) == 0) {
    ares_check_cleanup_conns(channel);
    aVar6 = ARES_SUCCESS;
    do {
      node = ares_slist_node_first(channel->queries_by_timeout);
      if (node == (ares_slist_node_t *)0x0) goto LAB_00113faf;
      paVar19 = (ares_query_t *)ares_slist_node_val(node);
      lVar3 = (paVar19->timeout).sec;
      if ((lVar3 < local_78.sec) ||
         ((iVar12 = 3, -1 < local_78.sec - lVar3 && ((paVar19->timeout).usec <= local_78.usec)))) {
        paVar19->timeouts = paVar19->timeouts + 1;
        server_increment_failures(paVar19->conn->server,paVar19->using_tcp);
        aVar6 = ares_requeue_query(paVar19,&local_78,ARES_ETIMEOUT,ARES_TRUE,
                                   (ares_dns_record_t *)0x0,(ares_array_t **)0x0);
        iVar12 = (uint)(aVar6 == ARES_ENOMEM) << 2;
      }
    } while (iVar12 == 0);
    if (iVar12 - 3U < 2) {
LAB_00113faf:
      requeue_status = ARES_CONN_ERR_SUCCESS;
      if (aVar6 == ARES_ENOMEM) {
        requeue_status = ARES_CONN_ERR_INVALID;
      }
    }
  }
LAB_00113fbc:
  aVar6 = ARES_SUCCESS;
  if (requeue_status == ARES_CONN_ERR_INVALID) {
    aVar6 = ARES_ENOMEM;
  }
  return aVar6;
LAB_00113f9f:
  requeue_status = ARES_CONN_ERR_INVALID;
  goto LAB_00113fbc;
}

Assistant:

static ares_status_t ares_process_fds_nolock(ares_channel_t         *channel,
                                             const ares_fd_events_t *events,
                                             size_t nevents, unsigned int flags)
{
  ares_timeval_t now;
  size_t         i;
  ares_status_t  status = ARES_SUCCESS;

  if (channel == NULL || (events == NULL && nevents != 0)) {
    return ARES_EFORMERR; /* LCOV_EXCL_LINE: DefensiveCoding */
  }

  ares_tvnow(&now);

  /* Process write events */
  for (i = 0; i < nevents; i++) {
    if (events[i].fd == ARES_SOCKET_BAD ||
        !(events[i].events & ARES_FD_EVENT_WRITE)) {
      continue;
    }
    status = process_write(channel, events[i].fd);
    /* We only care about ENOMEM, anything else is handled via connection
     * retries, etc */
    if (status == ARES_ENOMEM) {
      goto done;
    }
  }

  /* Process read events */
  for (i = 0; i < nevents; i++) {
    if (events[i].fd == ARES_SOCKET_BAD ||
        !(events[i].events & ARES_FD_EVENT_READ)) {
      continue;
    }
    status = process_read(channel, events[i].fd, &now);
    if (status == ARES_ENOMEM) {
      goto done;
    }
  }

  if (!(flags & ARES_PROCESS_FLAG_SKIP_NON_FD)) {
    ares_check_cleanup_conns(channel);
    status = process_timeouts(channel, &now);
    if (status == ARES_ENOMEM) {
      goto done;
    }
  }

done:
  if (status == ARES_ENOMEM) {
    return ARES_ENOMEM;
  }
  return ARES_SUCCESS;
}